

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::StringTrieBuilder::IntermediateValueNode::operator==
          (IntermediateValueNode *this,Node *other)

{
  UBool UVar1;
  IntermediateValueNode *o;
  Node *other_local;
  IntermediateValueNode *this_local;
  
  if (this == (IntermediateValueNode *)other) {
    this_local._7_1_ = true;
  }
  else {
    UVar1 = ValueNode::operator==(&this->super_ValueNode,other);
    if (UVar1 == '\0') {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = this->next == *(Node **)&other[1].hash;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
StringTrieBuilder::IntermediateValueNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!ValueNode::operator==(other)) {
        return FALSE;
    }
    const IntermediateValueNode &o=(const IntermediateValueNode &)other;
    return next==o.next;
}